

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::ResetInlineCaches(FunctionBody *this)

{
  SetInlineCacheCount(this,0);
  SetRootObjectLoadInlineCacheStart(this,0);
  SetRootObjectStoreInlineCacheStart(this,0);
  SetIsInstInlineCacheCount(this,0);
  (this->inlineCaches).ptr = (void **)0x0;
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::ResetInlineCaches()
    {
        SetInlineCacheCount(0);
        SetRootObjectLoadInlineCacheStart(0);
        SetRootObjectStoreInlineCacheStart(0);
        SetIsInstInlineCacheCount(0);
        this->inlineCaches = nullptr;
        this->polymorphicInlineCaches.Reset();
    }